

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O2

Scal __thiscall LinearExpert::queryHafterZX(LinearExpert *this)

{
  ResScalar RVar1;
  double dVar2;
  ResScalar RVar3;
  double dVar4;
  double dVar5;
  X *local_28 [2];
  ZZ *local_18;
  Z *local_10;
  
  local_10 = &this->dz;
  local_18 = &this->invSigma;
  RVar1 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_10,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                 *)&local_18);
  dVar2 = exp(RVar1 * -0.5);
  dVar5 = this->sqrtDetInvSigma;
  local_28[0] = &this->dx;
  RVar3 = Eigen::internal::
          dot_nocheck<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
          ::run((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)local_28,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->invPsi);
  dVar4 = exp(RVar3 * -0.5);
  dVar5 = dVar4 * dVar2 * dVar5 * this->sqrtDetInvPsi;
  this->h = dVar5;
  return dVar5;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryHafterZX()
{
    h = exp(-0.5*dz.dot(invSigma * dz)) * sqrtDetInvSigma * exp(-0.5*dx.cwiseAbs2().dot(invPsi)) * sqrtDetInvPsi;

    return h;
}